

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall
VariationalBayesEstimatorOnLDA::~VariationalBayesEstimatorOnLDA
          (VariationalBayesEstimatorOnLDA *this)

{
  VariationalBayesEstimatorOnLDA *this_local;
  
  ~VariationalBayesEstimatorOnLDA(this);
  operator_delete(this);
  return;
}

Assistant:

VariationalBayesEstimatorOnLDA::~VariationalBayesEstimatorOnLDA(){//{{{

}